

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

int NGA_Create_ghosts_irreg(int type,int ndim,int *dims,int *width,char *name,int *block,int *map)

{
  ulong uVar1;
  Integer *map_00;
  logical lVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  Integer g_a;
  Integer _ga_width [7];
  Integer _ga_work [7];
  Integer _ga_dims [7];
  
  iVar3 = 0;
  if (ndim < 8) {
    uVar1 = (ulong)(uint)ndim;
    uVar4 = uVar1;
    if (0 < ndim) {
      do {
        _ga_dims[uVar4 - 1] = (long)*dims;
        dims = dims + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    uVar4 = uVar1;
    piVar5 = block;
    if (0 < ndim) {
      do {
        _ga_work[uVar4 - 1] = (long)*piVar5;
        uVar4 = uVar4 - 1;
        piVar5 = piVar5 + 1;
      } while (uVar4 != 0);
    }
    if (0 < ndim) {
      do {
        _ga_width[uVar1 - 1] = (long)*width;
        width = width + 1;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    map_00 = copy_map(block,ndim,map);
    _ga_irreg_flag = 1;
    lVar2 = pnga_create_ghosts_irreg
                      ((long)type,(long)ndim,_ga_dims,_ga_width,name,map_00,_ga_work,&g_a);
    _ga_irreg_flag = 0;
    free(map_00);
    iVar3 = 0;
    if (lVar2 == 1) {
      iVar3 = (int)g_a;
    }
  }
  return iVar3;
}

Assistant:

int NGA_Create_ghosts_irreg(int type,int ndim,int dims[],int width[],char *name, int block[],int map[])
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer _ga_width[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    COPYC2F(width,_ga_width, ndim);
    _ga_map_capi = copy_map(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_ghosts_irreg(type, (Integer)ndim, _ga_dims, _ga_width,
            name, _ga_map_capi, _ga_work, &g_a);
    _ga_irreg_flag = 0; /* unset it, after creating array */ 

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}